

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  parasail_result_t *ppVar5;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  ulong uVar6;
  int *piVar7;
  char *pcVar8;
  undefined4 uVar9;
  ulong uVar10;
  int *piVar11;
  size_t size;
  size_t size_00;
  ulong size_01;
  ulong uVar12;
  long lVar13;
  char *__format;
  int iVar14;
  int iVar15;
  int a;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar8 = "_s2";
LAB_004f8c93:
    fprintf(_stderr,__format,"parasail_nw_stats_table_scan",pcVar8);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar8 = "s2Len";
    goto LAB_004f8c93;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar8 = "open";
    goto LAB_004f8c93;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar8 = "gap";
    goto LAB_004f8c93;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar8 = "matrix";
    goto LAB_004f8c93;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_nw_stats_table_scan");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar8 = "_s1";
      goto LAB_004f8c93;
    }
    uVar10 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar8 = "_s1Len";
      goto LAB_004f8c93;
    }
    if (matrix->type == 0) goto LAB_004f8422;
  }
  uVar10 = (ulong)(uint)matrix->length;
LAB_004f8422:
  a = (int)uVar10;
  ppVar5 = parasail_result_new_table3(a,s2Len);
  if (ppVar5 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar5->flag = ppVar5->flag | 0x1430201;
  size = (size_t)a;
  ptr = parasail_memalign_int(0x10,size);
  size_01 = (ulong)(uint)s2Len;
  ptr_00 = parasail_memalign_int(0x10,size_01);
  size_00 = (size_t)(a + 1);
  ptr_01 = parasail_memalign_int(0x10,size_00);
  ptr_02 = parasail_memalign_int(0x10,size_00);
  ptr_03 = parasail_memalign_int(0x10,size_00);
  ptr_04 = parasail_memalign_int(0x10,size_00);
  ptr_05 = parasail_memalign_int(0x10,size);
  ptr_06 = parasail_memalign_int(0x10,size);
  ptr_07 = parasail_memalign_int(0x10,size);
  ptr_08 = parasail_memalign_int(0x10,size);
  ptr_09 = parasail_memalign_int(0x10,size_00);
  ptr_10 = parasail_memalign_int(0x10,size_00);
  ptr_11 = parasail_memalign_int(0x10,size_00);
  ptr_12 = parasail_memalign_int(0x10,size_00);
  ptr_13 = parasail_memalign_int(0x10,size);
  auVar17._0_4_ = -(uint)((int)ptr == 0);
  auVar17._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
  auVar17._8_4_ = -(uint)((int)ptr_00 == 0);
  auVar17._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
  auVar23._4_4_ = auVar17._0_4_;
  auVar23._0_4_ = auVar17._4_4_;
  auVar23._8_4_ = auVar17._12_4_;
  auVar23._12_4_ = auVar17._8_4_;
  auVar19._0_4_ = -(uint)((int)ptr_01 == 0);
  auVar19._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
  auVar19._8_4_ = -(uint)((int)ptr_02 == 0);
  auVar19._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
  auVar24._4_4_ = auVar19._0_4_;
  auVar24._0_4_ = auVar19._4_4_;
  auVar24._8_4_ = auVar19._12_4_;
  auVar24._12_4_ = auVar19._8_4_;
  auVar24 = packssdw(auVar23 & auVar17,auVar24 & auVar19);
  auVar21._0_4_ = -(uint)((int)ptr_03 == 0);
  auVar21._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
  auVar21._8_4_ = -(uint)((int)ptr_04 == 0);
  auVar21._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
  auVar16._4_4_ = auVar21._0_4_;
  auVar16._0_4_ = auVar21._4_4_;
  auVar16._8_4_ = auVar21._12_4_;
  auVar16._12_4_ = auVar21._8_4_;
  auVar22._0_4_ = -(uint)((int)ptr_05 == 0);
  auVar22._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
  auVar22._8_4_ = -(uint)((int)ptr_06 == 0);
  auVar22._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
  auVar20._4_4_ = auVar22._0_4_;
  auVar20._0_4_ = auVar22._4_4_;
  auVar20._8_4_ = auVar22._12_4_;
  auVar20._12_4_ = auVar22._8_4_;
  auVar17 = packssdw(auVar16 & auVar21,auVar20 & auVar22);
  auVar17 = packssdw(auVar24,auVar17);
  if ((((((((auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar17[0xf] < '\0') {
    return (parasail_result_t *)0x0;
  }
  auVar18._0_4_ = -(uint)((int)((ulong)ptr_07 >> 0x20) == 0 && (int)ptr_07 == 0);
  auVar18._4_4_ = -(uint)((int)ptr_08 == 0 && (int)((ulong)ptr_08 >> 0x20) == 0);
  auVar18._8_4_ = -(uint)((int)((ulong)ptr_09 >> 0x20) == 0 && (int)ptr_09 == 0);
  auVar18._12_4_ = -(uint)((int)ptr_10 == 0 && (int)((ulong)ptr_10 >> 0x20) == 0);
  uVar1 = movmskps((int)ptr_10,auVar18);
  if ((char)uVar1 != '\0') {
    return (parasail_result_t *)0x0;
  }
  if (ptr_11 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_12 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_13 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  piVar7 = ptr_04 + 1;
  uVar6 = 0;
  uVar12 = 0;
  if (0 < a) {
    uVar12 = uVar10;
  }
  for (; uVar12 != uVar6; uVar6 = uVar6 + 1) {
    ptr[uVar6] = matrix->mapper[(byte)_s1[uVar6]];
  }
  piVar11 = matrix->mapper;
  for (uVar10 = 0; size_01 != uVar10; uVar10 = uVar10 + 1) {
    ptr_00[uVar10] = piVar11[(byte)_s2[uVar10]];
  }
  *ptr_01 = 0;
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  *ptr_09 = 0;
  iVar2 = -open;
  for (lVar13 = 1; lVar13 - uVar12 != 1; lVar13 = lVar13 + 1) {
    ptr_01[lVar13] = iVar2;
    ptr_02[lVar13] = 0;
    ptr_03[lVar13] = 0;
    ptr_04[lVar13] = 0;
    iVar2 = iVar2 - gap;
  }
  for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
    ptr_05[uVar10] = -0x40000000;
    ptr_06[uVar10] = 0;
    ptr_07[uVar10] = 0;
    ptr_08[uVar10] = 0;
  }
  uVar10 = 0;
  do {
    if (uVar10 == size_01) {
      ppVar5->score = ptr_01[size];
      ppVar5->end_query = a + -1;
      ppVar5->end_ref = s2Len + -1;
      ((ppVar5->field_4).stats)->matches = ptr_02[size];
      ((ppVar5->field_4).stats)->similar = ptr_03[size];
      ((ppVar5->field_4).stats)->length = ptr_04[size];
      parasail_free(ptr_13);
      parasail_free(ptr_12);
      parasail_free(ptr_11);
      parasail_free(ptr_10);
      parasail_free(ptr_09);
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar5;
    }
    for (lVar13 = 0; uVar12 * 4 - lVar13 != 0; lVar13 = lVar13 + 4) {
      iVar2 = *(int *)((long)ptr_01 + lVar13 + 4) - open;
      iVar14 = *(int *)((long)ptr_05 + lVar13) - gap;
      if (iVar14 < iVar2) {
        *(int *)((long)ptr_05 + lVar13) = iVar2;
        *(undefined4 *)((long)ptr_06 + lVar13) = *(undefined4 *)((long)ptr_02 + lVar13 + 4);
        *(undefined4 *)((long)ptr_07 + lVar13) = *(undefined4 *)((long)ptr_03 + lVar13 + 4);
        piVar11 = piVar7;
      }
      else {
        *(int *)((long)ptr_05 + lVar13) = iVar14;
        piVar11 = ptr_08;
      }
      *(int *)((long)ptr_08 + lVar13) = *(int *)((long)piVar11 + lVar13) + 1;
    }
    iVar2 = -((int)uVar10 * gap + open);
    *ptr_09 = iVar2;
    for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
      if (matrix->type == 0) {
        iVar14 = ptr[uVar6];
      }
      else {
        iVar14 = (int)uVar6;
      }
      iVar14 = matrix->matrix[(long)(matrix->size * iVar14) + (long)ptr_00[uVar10]];
      iVar15 = ptr_01[uVar6] + iVar14;
      ptr_13[uVar6] = (uint)(iVar15 < ptr_05[uVar6]);
      if (iVar15 < ptr_05[uVar6]) {
        ptr_09[uVar6 + 1] = ptr_05[uVar6];
        ptr_10[uVar6 + 1] = ptr_06[uVar6];
        ptr_11[uVar6 + 1] = ptr_07[uVar6];
        iVar14 = ptr_08[uVar6];
      }
      else {
        ptr_09[uVar6 + 1] = iVar15;
        ptr_10[uVar6 + 1] = (uint)(ptr[uVar6] == ptr_00[uVar10]) + ptr_02[uVar6];
        ptr_11[uVar6 + 1] = (uint)(0 < iVar14) + ptr_03[uVar6];
        iVar14 = ptr_04[uVar6] + 1;
      }
      ptr_12[uVar6 + 1] = iVar14;
    }
    iVar15 = -0x40000000;
    uVar1 = 0;
    uVar9 = 0;
    iVar14 = 0;
    uVar6 = uVar10;
    for (lVar13 = 0; uVar12 * 4 - lVar13 != 0; lVar13 = lVar13 + 4) {
      iVar3 = iVar15 - gap;
      iVar15 = *(int *)((long)ptr_09 + lVar13);
      if (*(int *)((long)ptr_09 + lVar13) <= iVar3) {
        iVar15 = iVar3;
      }
      if (iVar3 < *(int *)((long)ptr_01 + lVar13)) {
        uVar1 = *(undefined4 *)((long)ptr_02 + lVar13);
        uVar9 = *(undefined4 *)((long)ptr_03 + lVar13);
        iVar14 = *(int *)((long)ptr_04 + lVar13);
      }
      iVar4 = iVar15 - open;
      iVar14 = iVar14 + 1;
      iVar3 = *(int *)((long)ptr_09 + lVar13 + 4);
      if (iVar4 < iVar3) {
        *(int *)((long)ptr_01 + lVar13 + 4) = iVar3;
        *(undefined4 *)((long)ptr_02 + lVar13 + 4) = *(undefined4 *)((long)ptr_10 + lVar13 + 4);
        *(undefined4 *)((long)ptr_03 + lVar13 + 4) = *(undefined4 *)((long)ptr_11 + lVar13 + 4);
LAB_004f899a:
        iVar3 = *(int *)((long)ptr_12 + lVar13 + 4);
      }
      else {
        *(int *)((long)ptr_01 + lVar13 + 4) = iVar4;
        iVar3 = iVar14;
        if (*(int *)((long)ptr_09 + lVar13 + 4) == iVar4) {
          if (*(int *)((long)ptr_13 + lVar13) == 0) {
            *(undefined4 *)((long)ptr_02 + lVar13 + 4) = *(undefined4 *)((long)ptr_10 + lVar13 + 4);
            *(undefined4 *)((long)ptr_03 + lVar13 + 4) = *(undefined4 *)((long)ptr_11 + lVar13 + 4);
            goto LAB_004f899a;
          }
          *(undefined4 *)((long)ptr_02 + lVar13 + 4) = uVar1;
          *(undefined4 *)((long)ptr_03 + lVar13 + 4) = uVar9;
        }
        else {
          *(undefined4 *)((long)ptr_02 + lVar13 + 4) = uVar1;
          *(undefined4 *)((long)ptr_03 + lVar13 + 4) = uVar9;
        }
      }
      *(int *)((long)piVar7 + lVar13) = iVar3;
      *(undefined4 *)(*((ppVar5->field_4).trace)->trace_del_table + uVar6 * 4) =
           *(undefined4 *)((long)ptr_01 + lVar13 + 4);
      *(undefined4 *)(*(long *)((long)((ppVar5->field_4).trace)->trace_del_table + 8) + uVar6 * 4) =
           *(undefined4 *)((long)ptr_02 + lVar13 + 4);
      *(undefined4 *)
       (*(long *)((long)((ppVar5->field_4).trace)->trace_del_table + 0x10) + uVar6 * 4) =
           *(undefined4 *)((long)ptr_03 + lVar13 + 4);
      *(undefined4 *)
       (*(long *)((long)((ppVar5->field_4).trace)->trace_del_table + 0x18) + uVar6 * 4) =
           *(undefined4 *)((long)piVar7 + lVar13);
      uVar6 = uVar6 + size_01;
    }
    *ptr_01 = iVar2;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict HMB = NULL;
    int * restrict HM = NULL;
    int * restrict HSB = NULL;
    int * restrict HS = NULL;
    int * restrict HLB = NULL;
    int * restrict HL = NULL;
    int * restrict E = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB = NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB = NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB = NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = -open - i*gap;
        HM[i] = 0;
        HS[i] = 0;
        HL[i] = 0;
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = -open -j*gap;
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1] + 1;
            }
            else {
                FtL = FtL + 1;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
        }
        H[-1] = -open - j*gap;
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
    }

    result->score = H[s1Len-1];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;
    result->stats->matches = HM[s1Len-1];
    result->stats->similar = HS[s1Len-1];
    result->stats->length = HL[s1Len-1];

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}